

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerVk.cpp
# Opt level: O1

ResourceAttribs * __thiscall
Diligent::ShaderVariableManagerVk::GetResourceAttribs(ShaderVariableManagerVk *this,Uint32 Index)

{
  PipelineResourceAttribsType *pPVar1;
  char (*in_RCX) [13];
  string msg;
  string local_38;
  
  if ((this->
      super_ShaderVariableManagerBase<Diligent::EngineVkImplTraits,_Diligent::ShaderVariableVkImpl>)
      .m_pSignature == (PipelineResourceSignatureType *)0x0) {
    FormatString<char[26],char[13]>
              (&local_38,(Diligent *)"Debug expression failed:\n",(char (*) [26])"m_pSignature",
               in_RCX);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"GetResourceAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
               ,0xa8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  pPVar1 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetResourceAttribs
                     (&((this->
                        super_ShaderVariableManagerBase<Diligent::EngineVkImplTraits,_Diligent::ShaderVariableVkImpl>
                        ).m_pSignature)->
                       super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,Index);
  return pPVar1;
}

Assistant:

const ShaderVariableManagerVk::ResourceAttribs& ShaderVariableManagerVk::GetResourceAttribs(Uint32 Index) const
{
    VERIFY_EXPR(m_pSignature);
    return m_pSignature->GetResourceAttribs(Index);
}